

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_sec.c
# Opt level: O2

void CRYPTO_secure_free(void *ptr)

{
  size_t size;
  size_t len;
  long lVar1;
  int iVar2;
  uchar *addr;
  
  if (ptr == (void *)0x0) {
    return;
  }
  addr = _unprotected_ptr_from_user_ptr(ptr);
  lVar1 = page_size * -2;
  len = *(size_t *)(addr + page_size * -2);
  size = len + page_size * 3;
  _mprotect_readwrite(addr + lVar1,size);
  iVar2 = CRYPTO_memcmp((void *)((long)ptr + -0x10),canary,0x10);
  if (iVar2 == 0) {
    CRYPTO_munlock(addr,len);
    munmap(addr + lVar1,size);
    return;
  }
  abort();
}

Assistant:

void CRYPTO_secure_free(void *ptr)
{
    unsigned char *base_ptr;
    unsigned char *canary_ptr;
    unsigned char *unprotected_ptr;
    size_t         total_size;
    size_t         unprotected_size;

    if (ptr == NULL) {
        return;
    }
    canary_ptr      = ((unsigned char *) ptr) - sizeof canary;
    unprotected_ptr = _unprotected_ptr_from_user_ptr(ptr);
    base_ptr        = unprotected_ptr - page_size * 2U;
    memcpy(&unprotected_size, base_ptr, sizeof unprotected_size);
    total_size = page_size + page_size + unprotected_size + page_size;
    _mprotect_readwrite(base_ptr, total_size);
    if (CRYPTO_memcmp(canary_ptr, canary, sizeof canary) != 0) {
        _out_of_bounds();
    }
# ifndef HAVE_PAGE_PROTECTION
    if (CRYPTO_memcmp(unprotected_ptr + unprotected_size, canary,
                      sizeof canary) != 0) {
        _out_of_bounds();
    }
# endif
    CRYPTO_munlock(unprotected_ptr, unprotected_size);
    _free_aligned(base_ptr, total_size);
}